

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

int read_cached_features(vw *all,v_array<example_*> *examples)

{
  byte bVar1;
  example *peVar2;
  example **ppeVar3;
  size_t sVar4;
  ostream *poVar5;
  void *this;
  char **ppcVar6;
  ulong n;
  v_array<example_*> *in_RSI;
  undefined8 *in_RDI;
  int64_t s_diff;
  uint64_t diff;
  feature_value v;
  feature_index i;
  uint64_t last;
  char *end;
  size_t storage;
  features *ours;
  uchar index;
  size_t temp;
  uchar num_indices;
  char *c;
  size_t total;
  io_buf *input;
  example *ae;
  uchar *in_stack_ffffffffffffff68;
  example *in_stack_ffffffffffffff70;
  io_buf *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar7;
  uint64_t local_78;
  uint64_t local_70;
  byte *in_stack_ffffffffffffff98;
  char **in_stack_ffffffffffffffa0;
  io_buf *in_stack_ffffffffffffffa8;
  char local_39;
  byte *local_38;
  long local_30;
  int local_4;
  
  ppeVar3 = v_array<example_*>::operator[](in_RSI,0);
  peVar2 = *ppeVar3;
  peVar2->sorted = (bool)(*(byte *)(in_RDI[1] + 0x212) & 1);
  local_30 = (**(code **)(in_RDI[1] + 0x348))(*in_RDI,&peVar2->l,*(undefined8 *)(in_RDI[1] + 0x1e8))
  ;
  if (local_30 == 0) {
    local_4 = 0;
  }
  else {
    sVar4 = read_cached_tag(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if (sVar4 == 0) {
      local_4 = 0;
    }
    else {
      sVar4 = io_buf::buf_read(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                               (size_t)in_stack_ffffffffffffff98);
      if (sVar4 == 0) {
        local_4 = 0;
      }
      else {
        local_39 = *local_38;
        local_38 = local_38 + 1;
        io_buf::set(*(io_buf **)(in_RDI[1] + 0x1e8),(char *)local_38);
        for (; local_39 != '\0'; local_39 = local_39 + -1) {
          sVar4 = io_buf::buf_read(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                   (size_t)in_stack_ffffffffffffff98);
          if (sVar4 < 9) {
            poVar5 = std::operator<<((ostream *)(in_RDI + 0x1c),"truncated example! ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4);
            poVar5 = std::operator<<(poVar5," ");
            this = (void *)std::ostream::operator<<(poVar5,10);
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            return 0;
          }
          bVar1 = *local_38;
          v_array<unsigned_char>::push_back
                    ((v_array<unsigned_char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          in_stack_ffffffffffffffa8 =
               (io_buf *)((peVar2->super_example_predict).feature_space + bVar1);
          in_stack_ffffffffffffffa0 = *(char ***)(local_38 + 1);
          local_38 = local_38 + 9;
          io_buf::set(*(io_buf **)(in_RDI[1] + 0x1e8),(char *)local_38);
          local_30 = (long)in_stack_ffffffffffffffa0 + local_30;
          ppcVar6 = (char **)io_buf::buf_read(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                              (size_t)in_stack_ffffffffffffff98);
          if (ppcVar6 < in_stack_ffffffffffffffa0) {
            poVar5 = std::operator<<((ostream *)(in_RDI + 0x1c),"truncated example! wanted: ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)in_stack_ffffffffffffffa0);
            poVar5 = std::operator<<(poVar5," bytes");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            return 0;
          }
          in_stack_ffffffffffffff98 = local_38 + (long)in_stack_ffffffffffffffa0;
          local_70 = 0;
          while (local_38 != in_stack_ffffffffffffff98) {
            local_78 = 0;
            local_38 = (byte *)run_len_decode((char *)local_38,&local_78);
            uVar7 = 0x3f800000;
            if ((local_78 & 1) == 0) {
              if ((local_78 & 2) != 0) {
                uVar7 = *(undefined4 *)local_38;
                local_38 = local_38 + 4;
              }
            }
            else {
              uVar7 = 0xbf800000;
            }
            n = local_78 >> 2;
            in_stack_ffffffffffffff70 = (example *)ZigZagDecode(n);
            if ((long)in_stack_ffffffffffffff70 < 0) {
              peVar2->sorted = false;
            }
            local_78 = (long)(in_stack_ffffffffffffff70->super_example_predict).feature_space +
                       (local_70 - 0x20);
            local_70 = local_78;
            features::push_back((features *)CONCAT44(uVar7,in_stack_ffffffffffffff80),
                                (feature_value)(n >> 0x20),(feature_index)in_stack_ffffffffffffff70)
            ;
          }
          io_buf::set(*(io_buf **)(in_RDI[1] + 0x1e8),(char *)local_38);
        }
        local_4 = (int)local_30;
      }
    }
  }
  return local_4;
}

Assistant:

int read_cached_features(vw* all, v_array<example*>& examples)
{
  example* ae = examples[0];
  ae->sorted = all->p->sorted_cache;
  io_buf* input = all->p->input;

  size_t total = all->p->lp.read_cached_label(all->sd, &ae->l, *input);
  if (total == 0)
    return 0;
  if (read_cached_tag(*input, ae) == 0)
    return 0;
  char* c;
  unsigned char num_indices = 0;
  if (input->buf_read(c, sizeof(num_indices)) < sizeof(num_indices))
    return 0;
  num_indices = *(unsigned char*)c;
  c += sizeof(num_indices);

  all->p->input->set(c);
  for (; num_indices > 0; num_indices--)
  {
    size_t temp;
    unsigned char index = 0;
    if ((temp = input->buf_read(c, sizeof(index) + sizeof(size_t))) < sizeof(index) + sizeof(size_t))
    {
      all->trace_message << "truncated example! " << temp << " " << char_size + sizeof(size_t) << endl;
      return 0;
    }

    index = *(unsigned char*)c;
    c += sizeof(index);
    ae->indices.push_back((size_t)index);
    features& ours = ae->feature_space[index];
    size_t storage = *(size_t*)c;
    c += sizeof(size_t);
    all->p->input->set(c);
    total += storage;
    if (input->buf_read(c, storage) < storage)
    {
      all->trace_message << "truncated example! wanted: " << storage << " bytes" << endl;
      return 0;
    }

    char* end = c + storage;

    uint64_t last = 0;

    for (; c != end;)
    {
      feature_index i = 0;
      c = run_len_decode(c, i);
      feature_value v = 1.f;
      if (i & neg_1)
        v = -1.;
      else if (i & general)
      {
        v = ((one_float*)c)->f;
        c += sizeof(float);
      }
      uint64_t diff = i >> 2;
      int64_t s_diff = ZigZagDecode(diff);
      if (s_diff < 0)
        ae->sorted = false;
      i = last + s_diff;
      last = i;
      ours.push_back(v, i);
    }
    all->p->input->set(c);
  }

  return (int)total;
}